

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Throw.cpp
# Opt level: O3

void Js::Throw::StackOverflow(ScriptContext *scriptContext,PVOID returnAddress)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined8 uVar4;
  
  if (DAT_015b6709 == '\x01') {
    Output::Print(L"SystemException: StackOverflow\n");
    Output::Flush();
  }
  bVar2 = JsUtil::ExternalApi::RaiseStackOverflowIfScriptActive(scriptContext,returnAddress);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Exceptions/Throw.cpp"
                         ,0x9a,"(false)","We shouldn\'t be here");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&StackOverflowException::typeinfo,0);
}

Assistant:

void Throw::StackOverflow(ScriptContext *scriptContext, PVOID returnAddress)
    {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CONFIG_FLAG(PrintSystemException))
        {
            Output::Print(_u("SystemException: StackOverflow\n"));
            Output::Flush();
        }
#endif
        if (JsUtil::ExternalApi::RaiseStackOverflowIfScriptActive(scriptContext, returnAddress))
        {
            AssertMsg(false, "We shouldn't be here");
        }
        throw StackOverflowException();
    }